

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Reader * __thiscall
capnp::LocalCallContext::getParams(Reader *__return_storage_ptr__,LocalCallContext *this)

{
  Own<capnp::MallocMessageBuilder,_std::nullptr_t> *this_00;
  MallocMessageBuilder *this_01;
  Fault local_40;
  Fault f;
  Own<capnp::MallocMessageBuilder,_std::nullptr_t> *r;
  Own<capnp::MallocMessageBuilder,_std::nullptr_t> *_r153;
  LocalCallContext *this_local;
  
  this_00 = kj::_::readMaybe<capnp::MallocMessageBuilder,decltype(nullptr)>(&this->request);
  if (this_00 != (Own<capnp::MallocMessageBuilder,_std::nullptr_t> *)0x0) {
    this_01 = kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>::get(this_00);
    MessageBuilder::getRoot<capnp::AnyPointer>((Builder *)&f,&this_01->super_MessageBuilder);
    AnyPointer::Builder::operator_cast_to_Reader(__return_storage_ptr__,(Builder *)&f);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
             ,0x9c,FAILED,(char *)0x0,"\"Can\'t call getParams() after releaseParams().\"",
             (char (*) [46])"Can\'t call getParams() after releaseParams().");
  kj::_::Debug::Fault::fatal(&local_40);
}

Assistant:

AnyPointer::Reader getParams() override {
    KJ_IF_SOME(r, request) {
      return r.get()->getRoot<AnyPointer>();
    } else {
      KJ_FAIL_REQUIRE("Can't call getParams() after releaseParams().");
    }